

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

int Abc_NtkSuppCharCommon(uint *pBuffer,Vec_Int_t *vOne)

{
  int iVar1;
  undefined4 local_24;
  int nCommon;
  int Entry;
  int i;
  Vec_Int_t *vOne_local;
  uint *pBuffer_local;
  
  local_24 = 0;
  for (nCommon = 0; iVar1 = Vec_IntSize(vOne), nCommon < iVar1; nCommon = nCommon + 1) {
    iVar1 = Vec_IntEntry(vOne,nCommon);
    iVar1 = Abc_InfoHasBit(pBuffer,iVar1);
    local_24 = iVar1 + local_24;
  }
  return local_24;
}

Assistant:

int Abc_NtkSuppCharCommon( unsigned * pBuffer, Vec_Int_t * vOne )
{
    int i, Entry, nCommon = 0;
    Vec_IntForEachEntry( vOne, Entry, i )
        nCommon += Abc_InfoHasBit(pBuffer, Entry);
    return nCommon;
}